

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_flow_event_e fhndl_resend(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  uint uVar1;
  pcp_errno pVar2;
  pcp_server_t *s_00;
  uint32_t local_38;
  uint32_t local_34;
  uint local_30;
  pcp_server_t *s;
  pcp_recv_msg_t *msg_local;
  pcp_flow_t *f_local;
  
  s_00 = get_pcp_server(f->ctx,f->pcp_server_indx);
  if (s_00 == (pcp_server_t *)0x0) {
    f_local._4_4_ = fev_failed;
  }
  else {
    uVar1 = f->retry_count + 1;
    f->retry_count = uVar1;
    if (uVar1 < 3) {
      pVar2 = pcp_flow_send_msg(f,s_00);
      if (pVar2 == PCP_ERR_SUCCESS) {
        f->resend_timeout = f->resend_timeout << 1;
        uVar1 = rand();
        if (f->resend_timeout < 0xbb9) {
          local_30 = 3000;
        }
        else {
          local_30 = f->resend_timeout;
        }
        if (local_30 < 0xfa000) {
          if (f->resend_timeout < 0xbb9) {
            local_34 = 3000;
          }
          else {
            local_34 = f->resend_timeout;
          }
          local_38 = local_34;
        }
        else {
          local_38 = 0xfa000;
        }
        f->resend_timeout = (0x2400 - (uVar1 & 0x7ff)) * local_38 >> 0xd;
        gettimeofday((timeval *)&f->timeout,(__timezone_ptr_t)0x0);
        (f->timeout).tv_sec = (ulong)f->resend_timeout / 1000 + (f->timeout).tv_sec;
        (f->timeout).tv_usec = (ulong)((f->resend_timeout % 1000) * 1000) + (f->timeout).tv_usec;
        f_local._4_4_ = fev_msg_sent;
      }
      else {
        f_local._4_4_ = fev_failed;
      }
    }
    else {
      f_local._4_4_ = fev_failed;
    }
  }
  return f_local._4_4_;
}

Assistant:

static pcp_flow_event_e fhndl_resend(pcp_flow_t *f,
                                     UNUSED pcp_recv_msg_t *msg) {
    pcp_server_t *s = get_pcp_server(f->ctx, f->pcp_server_indx);
    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!s) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return fev_failed;
    }

#if PCP_RETX_MRC > 0
    if (++f->retry_count >= PCP_RETX_MRC) {
        return fev_failed;
    }
#endif

    if (pcp_flow_send_msg(f, s) != PCP_ERR_SUCCESS) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return fev_failed;
    }

    f->resend_timeout = PCP_RT(f->resend_timeout);

#if (PCP_RETX_MRD > 0)
    {
        int tdiff = (curtime - f->created_time) * 1000;
        if (tdiff > PCP_RETX_MRD) {
            return fev_failed;
        }
        if (tdiff > f->resend_timeout) {
            f->resend_timeout = tdiff;
        }
    }
#endif

    // set timeout field
    gettimeofday(&f->timeout, NULL);
    f->timeout.tv_sec += f->resend_timeout / 1000;
    f->timeout.tv_usec += (f->resend_timeout % 1000) * 1000;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return fev_msg_sent;
}